

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

void push_witness_stack(uchar **cursor,size_t *max,wally_tx_witness_stack *witness)

{
  ulong local_28;
  size_t i;
  wally_tx_witness_stack *witness_local;
  size_t *max_local;
  uchar **cursor_local;
  
  push_varint(cursor,max,witness->num_items);
  for (local_28 = 0; local_28 < witness->num_items; local_28 = local_28 + 1) {
    push_varbuff(cursor,max,witness->items[local_28].witness,witness->items[local_28].witness_len);
  }
  return;
}

Assistant:

static void push_witness_stack(unsigned char **cursor, size_t *max,
                               const struct wally_tx_witness_stack *witness)
{
    size_t i;

    push_varint(cursor, max, witness->num_items);
    for (i = 0; i < witness->num_items; ++i) {
        push_varbuff(cursor, max, witness->items[i].witness,
                     witness->items[i].witness_len);
    }
}